

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

BasicTimeZone * __thiscall icu_63::Calendar::getBasicTimeZone(Calendar *this)

{
  long lVar1;
  TimeZone *pTVar2;
  
  pTVar2 = this->fZone;
  if (pTVar2 == (TimeZone *)0x0) {
    pTVar2 = (TimeZone *)0x0;
  }
  else {
    lVar1 = __dynamic_cast(pTVar2,&TimeZone::typeinfo,&OlsonTimeZone::typeinfo,0);
    if ((((lVar1 == 0) &&
         (lVar1 = __dynamic_cast(pTVar2,&TimeZone::typeinfo,&SimpleTimeZone::typeinfo,0), lVar1 == 0
         )) && (lVar1 = __dynamic_cast(pTVar2,&TimeZone::typeinfo,&RuleBasedTimeZone::typeinfo,0),
               lVar1 == 0)) &&
       (lVar1 = __dynamic_cast(pTVar2,&TimeZone::typeinfo,&VTimeZone::typeinfo,0), lVar1 == 0)) {
      return (BasicTimeZone *)0x0;
    }
  }
  return (BasicTimeZone *)pTVar2;
}

Assistant:

BasicTimeZone*
Calendar::getBasicTimeZone(void) const {
    if (dynamic_cast<const OlsonTimeZone *>(fZone) != NULL
        || dynamic_cast<const SimpleTimeZone *>(fZone) != NULL
        || dynamic_cast<const RuleBasedTimeZone *>(fZone) != NULL
        || dynamic_cast<const VTimeZone *>(fZone) != NULL) {
        return (BasicTimeZone*)fZone;
    }
    return NULL;
}